

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

size_t FindFirstOfSet(string *where_from,size_t pos,char *delim)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  
  pcVar1 = (where_from->_M_dataplus)._M_p;
  uVar2 = where_from->_M_string_length;
  do {
    uVar5 = pos;
    bVar3 = ChrCmp(pcVar1[uVar5],delim);
    if (bVar3) break;
    pos = uVar5 + 1;
  } while (uVar5 < uVar2);
  sVar4 = 0xffffffffffffffff;
  if (uVar2 + 1 != uVar5 + 1) {
    sVar4 = uVar5;
  }
  return sVar4;
}

Assistant:

size_t FindFirstOfSet(const std::string& where_from, size_t pos, const char* delim)
{ 
    while ((!ChrCmp(where_from[pos], delim)) && (pos < where_from.size()))
        pos++;
    
    if (pos == where_from.size())
        return std::string::npos;
    else
        return pos;
}